

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

bool server::searchmodename(char *haystack,char *needle)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char *pcVar4;
  bool bVar5;
  char *pcVar6;
  
  cVar1 = *needle;
  if (cVar1 == '\0') {
LAB_001338a1:
    bVar5 = true;
  }
  else {
    do {
      pcVar4 = haystack;
      pcVar6 = needle + 1;
      if (cVar1 != '.') {
        pcVar4 = strchr(haystack,(int)cVar1);
        if (pcVar4 == (char *)0x0) break;
        pcVar4 = pcVar4 + 1;
        haystack = pcVar4;
      }
      while( true ) {
        cVar2 = *pcVar4;
        cVar3 = *pcVar6;
        if (cVar2 == '\0') break;
        if (cVar3 == '\0') goto LAB_001338a1;
        if (cVar2 == cVar3) {
          pcVar6 = pcVar6 + 1;
        }
        else if (cVar2 != ' ') break;
        pcVar4 = pcVar4 + 1;
      }
      if (cVar3 == '\0') goto LAB_001338a1;
      if (cVar3 == '.') {
        return cVar2 == '\0';
      }
    } while (cVar1 != '.');
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool searchmodename(const char *haystack, const char *needle)
    {
        if(!needle[0]) return true;
        do
        {
            if(needle[0] != '.')
            {
                haystack = strchr(haystack, needle[0]);
                if(!haystack) break;
                haystack++;
            }
            const char *h = haystack, *n = needle+1;
            for(; *h && *n; h++)
            {
                if(*h == *n) n++;
                else if(*h != ' ') break;
            }
            if(!*n) return true;
            if(*n == '.') return !*h;
        } while(needle[0] != '.');
        return false;
    }